

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::getReadableDescriptionOfByteSize_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,uint64_t bytes)

{
  int maxDecimalPlaces;
  double dVar1;
  undefined1 auVar2 [16];
  string local_30;
  
  if (this == (soul *)0x1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1 byte",(allocator<char> *)&local_30);
  }
  else {
    if (this < (soul *)0x400) {
      std::__cxx11::to_string(&local_30,(unsigned_long)this);
      std::operator+(__return_storage_ptr__,&local_30," bytes");
    }
    else {
      auVar2._8_4_ = (int)((ulong)this >> 0x20);
      auVar2._0_8_ = this;
      auVar2._12_4_ = 0x45300000;
      dVar1 = (auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
      maxDecimalPlaces = (int)bytes;
      if (this < (soul *)0x100000) {
        choc::text::floatToString_abi_cxx11_
                  (&local_30,(text *)0x1,dVar1 * 0.0009765625,maxDecimalPlaces);
        std::operator+(__return_storage_ptr__,&local_30," KB");
      }
      else if (this < (soul *)0x40000000) {
        choc::text::floatToString_abi_cxx11_
                  (&local_30,(text *)0x1,dVar1 * 9.5367431640625e-07,maxDecimalPlaces);
        std::operator+(__return_storage_ptr__,&local_30," MB");
      }
      else {
        choc::text::floatToString_abi_cxx11_
                  (&local_30,(text *)0x1,dVar1 * 9.313225746154785e-10,maxDecimalPlaces);
        std::operator+(__return_storage_ptr__,&local_30," GB");
      }
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getReadableDescriptionOfByteSize (uint64_t bytes)
{
    if (bytes == 1)                  return "1 byte";
    if (bytes < 1024)                return std::to_string (bytes) + " bytes";
    if (bytes < 1024 * 1024)         return choc::text::floatToString (double (bytes) / 1024.0, 1)                     + " KB";
    if (bytes < 1024 * 1024 * 1024)  return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0), 1)          + " MB";
    else                             return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0 * 1024.0), 1) + " GB";
}